

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortHelper.cpp
# Opt level: O2

bool Kernel::SortHelper::allTopLevelArgsAreSorts(AtomicSort *sort)

{
  ulong uVar1;
  uint uVar2;
  long lVar3;
  
  uVar2 = *(uint *)&(sort->super_Term).field_0xc & 0xfffffff;
  lVar3 = 0;
  while ((-lVar3 != (ulong)uVar2 &&
         ((uVar1 = (sort->super_Term)._args[(ulong)uVar2 + lVar3]._content, (uVar1 & 1) != 0 ||
          ((*(byte *)(uVar1 + 0x28) & 0x20) != 0))))) {
    lVar3 = lVar3 + -1;
  }
  return (ulong)uVar2 <= (ulong)-lVar3;
}

Assistant:

bool SortHelper::allTopLevelArgsAreSorts(AtomicSort* sort)
{
  for(unsigned i = 0; i < sort->arity(); i++){
    TermList arg = *sort->nthArgument(i);
    if(arg.isVar()){
      continue;
    }
    if(!arg.term()->isSort()){
      return false;
    }
  }
  return true;
}